

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O1

string * miniros::names::clean(string *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  for (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2584a2,0);
      uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2584a2,uVar2)) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  }
  if ((name->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      '/')) {
    std::__cxx11::string::erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string clean(const std::string& name)
{
  std::string clean = name;

  size_t pos = clean.find("//");
  while (pos != std::string::npos)
  {
    clean.erase(pos, 1);
    pos = clean.find("//", pos);
  }

  if (!name.empty() && *clean.rbegin() == '/')
  {
    clean.erase(clean.size() - 1, 1);
  }

  return clean;
}